

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_string.c
# Opt level: O0

ngx_int_t ngx_decode_base64_internal(ngx_str_t *dst,ngx_str_t *src,u_char *basis)

{
  byte *pbVar1;
  byte *local_40;
  u_char *s;
  u_char *d;
  size_t len;
  u_char *basis_local;
  ngx_str_t *src_local;
  ngx_str_t *dst_local;
  
  for (d = (u_char *)0x0; (d < (u_char *)src->len && (src->data[(long)d] != '=')); d = d + 1) {
    if (basis[src->data[(long)d]] == 'M') {
      return -1;
    }
  }
  if (((ulong)d & 3) == 1) {
    dst_local = (ngx_str_t *)0xffffffffffffffff;
  }
  else {
    local_40 = src->data;
    s = dst->data;
    for (; (u_char *)0x3 < d; d = d + -4) {
      *s = basis[*local_40] << 2 | (byte)((int)(uint)basis[local_40[1]] >> 4);
      pbVar1 = s + 2;
      s[1] = basis[local_40[1]] << 4 | (byte)((int)(uint)basis[local_40[2]] >> 2);
      s = s + 3;
      *pbVar1 = basis[local_40[2]] << 6 | basis[local_40[3]];
      local_40 = local_40 + 4;
    }
    if (&DAT_00000001 < d) {
      *s = basis[*local_40] << 2 | (byte)((int)(uint)basis[local_40[1]] >> 4);
      s = s + 1;
    }
    if ((u_char *)0x2 < d) {
      *s = basis[local_40[1]] << 4 | (byte)((int)(uint)basis[local_40[2]] >> 2);
      s = s + 1;
    }
    dst->len = (long)s - (long)dst->data;
    dst_local = (ngx_str_t *)0x0;
  }
  return (ngx_int_t)dst_local;
}

Assistant:

static ngx_int_t
ngx_decode_base64_internal(ngx_str_t *dst, ngx_str_t *src, const u_char *basis)
{
    size_t          len;
    u_char         *d, *s;

    for (len = 0; len < src->len; len++) {
        if (src->data[len] == '=') {
            break;
        }

        if (basis[src->data[len]] == 77) {
            return NGX_ERROR;
        }
    }

    if (len % 4 == 1) {
        return NGX_ERROR;
    }

    s = src->data;
    d = dst->data;

    while (len > 3) {
        *d++ = (u_char) (basis[s[0]] << 2 | basis[s[1]] >> 4);
        *d++ = (u_char) (basis[s[1]] << 4 | basis[s[2]] >> 2);
        *d++ = (u_char) (basis[s[2]] << 6 | basis[s[3]]);

        s += 4;
        len -= 4;
    }

    if (len > 1) {
        *d++ = (u_char) (basis[s[0]] << 2 | basis[s[1]] >> 4);
    }

    if (len > 2) {
        *d++ = (u_char) (basis[s[1]] << 4 | basis[s[2]] >> 2);
    }

    dst->len = d - dst->data;

    return NGX_OK;
}